

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

type_conflict2
jsoncons::detail::integer_to_hex<unsigned_char,std::__cxx11::string>
          (uchar value,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  bool bVar1;
  assertion_error *this;
  char cVar2;
  type_conflict2 tVar3;
  char *pcVar4;
  char_type buf [255];
  string local_148;
  char local_128 [264];
  
  pcVar4 = local_148.field_2._M_local_buf + 0xf;
  tVar3 = 0;
  do {
    cVar2 = '7';
    if ((value & 0xf) < 10) {
      cVar2 = '0';
    }
    pcVar4[1] = cVar2 + (value & 0xf);
    pcVar4 = pcVar4 + 1;
    tVar3 = tVar3 + 1;
    bVar1 = 0xf < value;
    value = value >> 4;
  } while (bVar1);
  if (tVar3 != 0xff) {
    do {
      std::__cxx11::string::push_back((char)result);
      pcVar4 = pcVar4 + -1;
    } while (local_128 <= pcVar4);
    return tVar3;
  }
  this = (assertion_error *)__cxa_allocate_exception(0x10);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"assertion \'p != last\' failed at  <> :0","");
  assertion_error::assertion_error(this,&local_148);
  __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    integer_to_hex(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = to_hex_character(0-(value % 16));
            }
            while ((value /= 16) && (p < last));
        }
        else
        {

            do
            {
                *p++ = to_hex_character(value % 16);
            }
            while ((value /= 16) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }